

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O2

ExprBase * CreateSequence(ExpressionContext *ctx,SynBase *source,ExprBase *first,ExprBase *second)

{
  int iVar1;
  undefined4 extraout_var;
  ArrayView<ExprBase_*> arr;
  ExprBase *second_local;
  SmallArray<ExprBase_*,_2U> expressions;
  ExprBase *first_local;
  
  expressions.allocator = ctx->allocator;
  expressions.data = expressions.little;
  expressions.count = 0;
  expressions.max = 2;
  second_local = second;
  first_local = first;
  SmallArray<ExprBase_*,_2U>::push_back(&expressions,&first_local);
  SmallArray<ExprBase_*,_2U>::push_back(&expressions,&second_local);
  iVar1 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x68);
  arr.count = expressions.count;
  arr.data = expressions.data;
  arr._12_4_ = 0;
  ExprSequence::ExprSequence
            ((ExprSequence *)CONCAT44(extraout_var,iVar1),ctx->allocator,source,second_local->type,
             arr);
  SmallArray<ExprBase_*,_2U>::~SmallArray(&expressions);
  return &((ExprSequence *)CONCAT44(extraout_var,iVar1))->super_ExprBase;
}

Assistant:

ExprBase* CreateSequence(ExpressionContext &ctx, SynBase *source, ExprBase *first, ExprBase *second)
{
	SmallArray<ExprBase*, 2> expressions(ctx.allocator);

	expressions.push_back(first);
	expressions.push_back(second);

	return new (ctx.get<ExprSequence>()) ExprSequence(ctx.allocator, source, second->type, expressions);
}